

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O3

string * __thiscall
spvtools::spvResultToString_abi_cxx11_
          (string *__return_storage_ptr__,spvtools *this,spv_result_t res)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch((int)this) {
  case 0:
    pcVar1 = "SPV_SUCCESS";
    break;
  case 1:
    pcVar1 = "SPV_UNSUPPORTED";
    break;
  case 2:
    pcVar1 = "SPV_END_OF_STREAM";
    break;
  case 3:
    pcVar1 = "SPV_WARNING";
    break;
  case 4:
    pcVar1 = "SPV_FAILED_MATCH";
    break;
  case 5:
    pcVar1 = "SPV_REQUESTED_TERMINATION";
    break;
  case -0xc:
    pcVar1 = "SPV_ERROR_INVALID_LAYOUT";
    break;
  case -0xb:
    pcVar1 = "SPV_ERROR_INVALID_CFG";
    break;
  case -10:
    pcVar1 = "SPV_ERROR_INVALID_ID";
    break;
  case -9:
    pcVar1 = "SPV_ERROR_INVALID_LOOKUP";
    break;
  case -8:
    pcVar1 = "SPV_ERROR_INVALID_DIAGNOSTIC";
    break;
  case -7:
    pcVar1 = "SPV_ERROR_INVALID_VALUE";
    break;
  case -6:
    pcVar1 = "SPV_ERROR_INVALID_TABLE";
    break;
  case -5:
    pcVar1 = "SPV_ERROR_INVALID_TEXT";
    break;
  case -4:
    pcVar1 = "SPV_ERROR_INVALID_BINARY";
    break;
  case -3:
    pcVar1 = "SPV_ERROR_INVALID_POINTER";
    break;
  case -2:
    pcVar1 = "SPV_ERROR_OUT_OF_MEMORY";
    break;
  case -1:
    pcVar1 = "SPV_ERROR_INTERNAL";
    break;
  default:
    pcVar1 = "Unknown Error";
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string spvResultToString(spv_result_t res) {
  std::string out;
  switch (res) {
    case SPV_SUCCESS:
      out = "SPV_SUCCESS";
      break;
    case SPV_UNSUPPORTED:
      out = "SPV_UNSUPPORTED";
      break;
    case SPV_END_OF_STREAM:
      out = "SPV_END_OF_STREAM";
      break;
    case SPV_WARNING:
      out = "SPV_WARNING";
      break;
    case SPV_FAILED_MATCH:
      out = "SPV_FAILED_MATCH";
      break;
    case SPV_REQUESTED_TERMINATION:
      out = "SPV_REQUESTED_TERMINATION";
      break;
    case SPV_ERROR_INTERNAL:
      out = "SPV_ERROR_INTERNAL";
      break;
    case SPV_ERROR_OUT_OF_MEMORY:
      out = "SPV_ERROR_OUT_OF_MEMORY";
      break;
    case SPV_ERROR_INVALID_POINTER:
      out = "SPV_ERROR_INVALID_POINTER";
      break;
    case SPV_ERROR_INVALID_BINARY:
      out = "SPV_ERROR_INVALID_BINARY";
      break;
    case SPV_ERROR_INVALID_TEXT:
      out = "SPV_ERROR_INVALID_TEXT";
      break;
    case SPV_ERROR_INVALID_TABLE:
      out = "SPV_ERROR_INVALID_TABLE";
      break;
    case SPV_ERROR_INVALID_VALUE:
      out = "SPV_ERROR_INVALID_VALUE";
      break;
    case SPV_ERROR_INVALID_DIAGNOSTIC:
      out = "SPV_ERROR_INVALID_DIAGNOSTIC";
      break;
    case SPV_ERROR_INVALID_LOOKUP:
      out = "SPV_ERROR_INVALID_LOOKUP";
      break;
    case SPV_ERROR_INVALID_ID:
      out = "SPV_ERROR_INVALID_ID";
      break;
    case SPV_ERROR_INVALID_CFG:
      out = "SPV_ERROR_INVALID_CFG";
      break;
    case SPV_ERROR_INVALID_LAYOUT:
      out = "SPV_ERROR_INVALID_LAYOUT";
      break;
    default:
      out = "Unknown Error";
  }
  return out;
}